

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)20>_> *
vkt::api::anon_unknown_1::Sampler::create
          (Move<vk::Handle<(vk::HandleType)20>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  VkSamplerCreateInfo local_58;
  
  local_58.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  local_58.pNext = (void *)0x0;
  local_58.flags = 0;
  local_58._20_8_ = *(undefined8 *)param_2;
  local_58._28_8_ = *(undefined8 *)(param_2 + 8);
  local_58._36_8_ = *(undefined8 *)(param_2 + 0x10);
  local_58.mipLodBias = *(float *)(param_2 + 0x18);
  local_58.anisotropyEnable = *(VkBool32 *)(param_2 + 0x1c);
  local_58.maxAnisotropy = *(float *)(param_2 + 0x20);
  local_58._56_8_ = *(undefined8 *)(param_2 + 0x24);
  local_58._64_8_ = *(undefined8 *)(param_2 + 0x2c);
  local_58._72_8_ = *(undefined8 *)(param_2 + 0x34);
  ::vk::createSampler(__return_storage_ptr__,env->vkd,env->device,&local_58,env->allocationCallbacks
                     );
  return __return_storage_ptr__;
}

Assistant:

static Move<VkSampler> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkSamplerCreateInfo	samplerInfo	=
		{
			VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,
			DE_NULL,
			(VkSamplerCreateFlags)0,
			params.magFilter,
			params.minFilter,
			params.mipmapMode,
			params.addressModeU,
			params.addressModeV,
			params.addressModeW,
			params.mipLodBias,
			params.anisotropyEnable,
			params.maxAnisotropy,
			params.compareEnable,
			params.compareOp,
			params.minLod,
			params.maxLod,
			params.borderColor,
			params.unnormalizedCoordinates
		};

		return createSampler(env.vkd, env.device, &samplerInfo, env.allocationCallbacks);
	}